

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

void __thiscall
NeuralConsumer::NeuralConsumer
          (NeuralConsumer *this,HighFreqDataType *hf,int ringbufsize,HFParsingInfo *parseargs)

{
  int iVar1;
  HFSubConsumer *in_RCX;
  HighFreqDataType *in_RSI;
  HighFreqDataType *in_RDI;
  HighFreqDataType *in_stack_ffffffffffffff00;
  allocator_type *__a;
  string *__value;
  undefined4 in_stack_ffffffffffffff18;
  allocator_type local_bf;
  undefined2 local_be;
  consumer_queue_filter in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  HighFreqDataType *in_stack_ffffffffffffffd8;
  
  HighFreqDataType::HighFreqDataType(in_RDI,(HighFreqDataType *)in_RCX);
  HFSubConsumer::HFSubConsumer
            (in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  HighFreqDataType::~HighFreqDataType(in_stack_ffffffffffffff00);
  (in_RDI->super_NetworkDataType)._vptr_NetworkDataType =
       (_func_int **)&PTR__NeuralConsumer_003752a8;
  __value = &in_RDI[6].sockAddr;
  iVar1 = HighFreqDataType::getByteSize(in_RSI);
  local_be = 0;
  __a = &local_bf;
  std::allocator<short>::allocator((allocator<short> *)0x1ced68);
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)in_RSI,
             CONCAT44(iVar1,in_stack_ffffffffffffff18),(value_type_conflict2 *)__value,__a);
  std::allocator<short>::~allocator((allocator<short> *)0x1ced8d);
  HFParsingInfo::HFParsingInfo
            ((HFParsingInfo *)in_RSI,(HFParsingInfo *)CONCAT44(iVar1,in_stack_ffffffffffffff18));
  *(undefined4 *)((long)&in_RDI[1].name.field_2 + 8) = 3;
  return;
}

Assistant:

NeuralConsumer::NeuralConsumer(HighFreqDataType hf, int ringbufsize, HFParsingInfo parseargs)
    : HFSubConsumer(hf, ringbufsize),
      tempinput(hf.getByteSize()/sizeof(int16_t), 0),
      args(parseargs)
{
    sockType = ST_FILTERED_CONSUMER;
}